

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.hpp
# Opt level: O2

uint32_t Keyset::shuffleBits(uint32_t x)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  
  uVar3 = 0;
  iVar2 = 4;
  while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
    uVar1 = uVar3 ^ x;
    x = x << 8;
    uVar3 = uVar3 << 8 ^ g_crc32_0x04C11DB7._M_elems[uVar1 >> 0x18];
  }
  return ~uVar3;
}

Assistant:

static uint32_t shuffleBits(uint32_t x)
	{
		auto crc = UINT32_C(0);
		for (auto i = 0; i < 4; ++i) {
			crc = (crc << 8) ^ g_crc32_0x04C11DB7[(rotateLeft(x ^ crc, 10) & 0x3FC) >> 2];
			x <<= 8;
		}
		return ~crc;
	}